

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctflt.c
# Opt level: O0

void jpeg_idct_float(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  JSAMPLE *pJVar1;
  JSAMPROW pJVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  JSAMPLE local_1a8 [4];
  float dcval;
  float workspace [64];
  int local_9c;
  int ctr;
  JSAMPLE *range_limit;
  JSAMPROW outptr;
  float *wsptr;
  FLOAT_MULT_TYPE *quantptr;
  JCOEFPTR inptr;
  float z13;
  float z12;
  float z11;
  float z10;
  float z5;
  float tmp13;
  float tmp12;
  float tmp11;
  float tmp10;
  float tmp7;
  float tmp6;
  float tmp5;
  float tmp4;
  float tmp3;
  float tmp2;
  float tmp1;
  float tmp0;
  JDIMENSION output_col_local;
  JSAMPARRAY output_buf_local;
  JCOEFPTR coef_block_local;
  jpeg_component_info *compptr_local;
  j_decompress_ptr cinfo_local;
  
  pJVar1 = cinfo->sample_range_limit;
  wsptr = (float *)compptr->dct_table;
  outptr = local_1a8;
  quantptr = (FLOAT_MULT_TYPE *)coef_block;
  for (local_9c = 8; 0 < local_9c; local_9c = local_9c + -1) {
    if ((((*(short *)(quantptr + 4) == 0) && (*(short *)(quantptr + 8) == 0)) &&
        (*(short *)(quantptr + 0xc) == 0)) &&
       (((*(short *)(quantptr + 0x10) == 0 && (*(short *)(quantptr + 0x14) == 0)) &&
        ((*(short *)(quantptr + 0x18) == 0 && (*(short *)(quantptr + 0x1c) == 0)))))) {
      fVar3 = (float)(int)*(short *)quantptr * *wsptr;
      *(float *)outptr = fVar3;
      *(float *)(outptr + 0x20) = fVar3;
      *(float *)(outptr + 0x40) = fVar3;
      *(float *)(outptr + 0x60) = fVar3;
      *(float *)(outptr + 0x80) = fVar3;
      *(float *)(outptr + 0xa0) = fVar3;
      *(float *)(outptr + 0xc0) = fVar3;
      *(float *)(outptr + 0xe0) = fVar3;
    }
    else {
      fVar4 = (float)(int)*(short *)quantptr * *wsptr +
              (float)(int)*(short *)(quantptr + 0x10) * wsptr[0x20];
      fVar5 = (float)(int)*(short *)quantptr * *wsptr -
              (float)(int)*(short *)(quantptr + 0x10) * wsptr[0x20];
      fVar3 = (float)(int)*(short *)(quantptr + 8) * wsptr[0x10] +
              (float)(int)*(short *)(quantptr + 0x18) * wsptr[0x30];
      fVar6 = ((float)(int)*(short *)(quantptr + 8) * wsptr[0x10] -
              (float)(int)*(short *)(quantptr + 0x18) * wsptr[0x30]) * 1.4142135 - fVar3;
      fVar7 = fVar4 + fVar3;
      fVar4 = fVar4 - fVar3;
      fVar3 = fVar5 + fVar6;
      fVar5 = fVar5 - fVar6;
      fVar6 = (float)(int)*(short *)(quantptr + 0x14) * wsptr[0x28] +
              (float)(int)*(short *)(quantptr + 0xc) * wsptr[0x18];
      fVar8 = (float)(int)*(short *)(quantptr + 0x14) * wsptr[0x28] -
              (float)(int)*(short *)(quantptr + 0xc) * wsptr[0x18];
      fVar9 = (float)(int)*(short *)(quantptr + 4) * wsptr[8] +
              (float)(int)*(short *)(quantptr + 0x1c) * wsptr[0x38];
      fVar10 = (float)(int)*(short *)(quantptr + 4) * wsptr[8] -
               (float)(int)*(short *)(quantptr + 0x1c) * wsptr[0x38];
      fVar11 = fVar9 + fVar6;
      fVar12 = (fVar8 + fVar10) * 1.847759;
      fVar8 = (-fVar8 * 2.613126 + fVar12) - fVar11;
      fVar6 = (fVar9 - fVar6) * 1.4142135 - fVar8;
      fVar9 = (-fVar10 * 1.0823922 + fVar12) - fVar6;
      *(float *)outptr = fVar7 + fVar11;
      *(float *)(outptr + 0xe0) = fVar7 - fVar11;
      *(float *)(outptr + 0x20) = fVar3 + fVar8;
      *(float *)(outptr + 0xc0) = fVar3 - fVar8;
      *(float *)(outptr + 0x40) = fVar5 + fVar6;
      *(float *)(outptr + 0xa0) = fVar5 - fVar6;
      *(float *)(outptr + 0x60) = fVar4 + fVar9;
      *(float *)(outptr + 0x80) = fVar4 - fVar9;
    }
    quantptr = (FLOAT_MULT_TYPE *)((long)quantptr + 2);
    wsptr = wsptr + 1;
    outptr = outptr + 4;
  }
  outptr = local_1a8;
  for (local_9c = 0; local_9c < 8; local_9c = local_9c + 1) {
    pJVar2 = output_buf[local_9c] + output_col;
    fVar4 = *(float *)outptr + 128.5 + *(float *)(outptr + 0x10);
    fVar5 = (*(float *)outptr + 128.5) - *(float *)(outptr + 0x10);
    fVar3 = *(float *)(outptr + 8) + *(float *)(outptr + 0x18);
    fVar6 = (*(float *)(outptr + 8) - *(float *)(outptr + 0x18)) * 1.4142135 + -fVar3;
    fVar7 = fVar4 + fVar3;
    fVar4 = fVar4 - fVar3;
    fVar3 = fVar5 + fVar6;
    fVar5 = fVar5 - fVar6;
    fVar6 = *(float *)(outptr + 4) + *(float *)(outptr + 0x1c) +
            *(float *)(outptr + 0x14) + *(float *)(outptr + 0xc);
    fVar8 = ((*(float *)(outptr + 0x14) - *(float *)(outptr + 0xc)) +
            (*(float *)(outptr + 4) - *(float *)(outptr + 0x1c))) * 1.847759;
    fVar9 = (-(*(float *)(outptr + 0x14) - *(float *)(outptr + 0xc)) * 2.613126 + fVar8) - fVar6;
    fVar10 = ((*(float *)(outptr + 4) + *(float *)(outptr + 0x1c)) -
             (*(float *)(outptr + 0x14) + *(float *)(outptr + 0xc))) * 1.4142135 - fVar9;
    fVar8 = (-(*(float *)(outptr + 4) - *(float *)(outptr + 0x1c)) * 1.0823922 + fVar8) - fVar10;
    *pJVar2 = pJVar1[(int)((int)(fVar7 + fVar6) & 0x3ff)];
    pJVar2[7] = pJVar1[(int)((int)(fVar7 - fVar6) & 0x3ff)];
    pJVar2[1] = pJVar1[(int)((int)(fVar3 + fVar9) & 0x3ff)];
    pJVar2[6] = pJVar1[(int)((int)(fVar3 - fVar9) & 0x3ff)];
    pJVar2[2] = pJVar1[(int)((int)(fVar5 + fVar10) & 0x3ff)];
    pJVar2[5] = pJVar1[(int)((int)(fVar5 - fVar10) & 0x3ff)];
    pJVar2[3] = pJVar1[(int)((int)(fVar4 + fVar8) & 0x3ff)];
    pJVar2[4] = pJVar1[(int)((int)(fVar4 - fVar8) & 0x3ff)];
    outptr = outptr + 0x20;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_float (j_decompress_ptr cinfo, jpeg_component_info * compptr,
		 JCOEFPTR coef_block,
		 JSAMPARRAY output_buf, JDIMENSION output_col)
{
  FAST_FLOAT tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6, tmp7;
  FAST_FLOAT tmp10, tmp11, tmp12, tmp13;
  FAST_FLOAT z5, z10, z11, z12, z13;
  JCOEFPTR inptr;
  FLOAT_MULT_TYPE * quantptr;
  FAST_FLOAT * wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = cinfo->sample_range_limit;
  int ctr;
  FAST_FLOAT workspace[DCTSIZE2]; /* buffers data between passes */

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (FLOAT_MULT_TYPE *) compptr->dct_table;
  wsptr = workspace;
  for (ctr = DCTSIZE; ctr > 0; ctr--) {
    /* Due to quantization, we will usually find that many of the input
     * coefficients are zero, especially the AC terms.  We can exploit this
     * by short-circuiting the IDCT calculation for any column in which all
     * the AC terms are zero.  In that case each output is equal to the
     * DC coefficient (with scale factor as needed).
     * With typical images and quantization tables, half or more of the
     * column DCT calculations can be simplified this way.
     */
    
    if (inptr[DCTSIZE*1] == 0 && inptr[DCTSIZE*2] == 0 &&
	inptr[DCTSIZE*3] == 0 && inptr[DCTSIZE*4] == 0 &&
	inptr[DCTSIZE*5] == 0 && inptr[DCTSIZE*6] == 0 &&
	inptr[DCTSIZE*7] == 0) {
      /* AC terms all zero */
      FAST_FLOAT dcval = DEQUANTIZE(inptr[DCTSIZE*0], quantptr[DCTSIZE*0]);
      
      wsptr[DCTSIZE*0] = dcval;
      wsptr[DCTSIZE*1] = dcval;
      wsptr[DCTSIZE*2] = dcval;
      wsptr[DCTSIZE*3] = dcval;
      wsptr[DCTSIZE*4] = dcval;
      wsptr[DCTSIZE*5] = dcval;
      wsptr[DCTSIZE*6] = dcval;
      wsptr[DCTSIZE*7] = dcval;
      
      inptr++;			/* advance pointers to next column */
      quantptr++;
      wsptr++;
      continue;
    }
    
    /* Even part */

    tmp0 = DEQUANTIZE(inptr[DCTSIZE*0], quantptr[DCTSIZE*0]);
    tmp1 = DEQUANTIZE(inptr[DCTSIZE*2], quantptr[DCTSIZE*2]);
    tmp2 = DEQUANTIZE(inptr[DCTSIZE*4], quantptr[DCTSIZE*4]);
    tmp3 = DEQUANTIZE(inptr[DCTSIZE*6], quantptr[DCTSIZE*6]);

    tmp10 = tmp0 + tmp2;	/* phase 3 */
    tmp11 = tmp0 - tmp2;

    tmp13 = tmp1 + tmp3;	/* phases 5-3 */
    tmp12 = (tmp1 - tmp3) * ((FAST_FLOAT) 1.414213562) - tmp13; /* 2*c4 */

    tmp0 = tmp10 + tmp13;	/* phase 2 */
    tmp3 = tmp10 - tmp13;
    tmp1 = tmp11 + tmp12;
    tmp2 = tmp11 - tmp12;
    
    /* Odd part */

    tmp4 = DEQUANTIZE(inptr[DCTSIZE*1], quantptr[DCTSIZE*1]);
    tmp5 = DEQUANTIZE(inptr[DCTSIZE*3], quantptr[DCTSIZE*3]);
    tmp6 = DEQUANTIZE(inptr[DCTSIZE*5], quantptr[DCTSIZE*5]);
    tmp7 = DEQUANTIZE(inptr[DCTSIZE*7], quantptr[DCTSIZE*7]);

    z13 = tmp6 + tmp5;		/* phase 6 */
    z10 = tmp6 - tmp5;
    z11 = tmp4 + tmp7;
    z12 = tmp4 - tmp7;

    tmp7 = z11 + z13;		/* phase 5 */
    tmp11 = (z11 - z13) * ((FAST_FLOAT) 1.414213562); /* 2*c4 */

    z5 = (z10 + z12) * ((FAST_FLOAT) 1.847759065); /* 2*c2 */
    tmp10 = z5 - z12 * ((FAST_FLOAT) 1.082392200); /* 2*(c2-c6) */
    tmp12 = z5 - z10 * ((FAST_FLOAT) 2.613125930); /* 2*(c2+c6) */

    tmp6 = tmp12 - tmp7;	/* phase 2 */
    tmp5 = tmp11 - tmp6;
    tmp4 = tmp10 - tmp5;

    wsptr[DCTSIZE*0] = tmp0 + tmp7;
    wsptr[DCTSIZE*7] = tmp0 - tmp7;
    wsptr[DCTSIZE*1] = tmp1 + tmp6;
    wsptr[DCTSIZE*6] = tmp1 - tmp6;
    wsptr[DCTSIZE*2] = tmp2 + tmp5;
    wsptr[DCTSIZE*5] = tmp2 - tmp5;
    wsptr[DCTSIZE*3] = tmp3 + tmp4;
    wsptr[DCTSIZE*4] = tmp3 - tmp4;

    inptr++;			/* advance pointers to next column */
    quantptr++;
    wsptr++;
  }
  
  /* Pass 2: process rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < DCTSIZE; ctr++) {
    outptr = output_buf[ctr] + output_col;
    /* Rows of zeroes can be exploited in the same way as we did with columns.
     * However, the column calculation has created many nonzero AC terms, so
     * the simplification applies less often (typically 5% to 10% of the time).
     * And testing floats for zero is relatively expensive, so we don't bother.
     */
    
    /* Even part */

    /* Apply signed->unsigned and prepare float->int conversion */
    z5 = wsptr[0] + ((FAST_FLOAT) CENTERJSAMPLE + (FAST_FLOAT) 0.5);
    tmp10 = z5 + wsptr[4];
    tmp11 = z5 - wsptr[4];

    tmp13 = wsptr[2] + wsptr[6];
    tmp12 = (wsptr[2] - wsptr[6]) * ((FAST_FLOAT) 1.414213562) - tmp13;

    tmp0 = tmp10 + tmp13;
    tmp3 = tmp10 - tmp13;
    tmp1 = tmp11 + tmp12;
    tmp2 = tmp11 - tmp12;

    /* Odd part */

    z13 = wsptr[5] + wsptr[3];
    z10 = wsptr[5] - wsptr[3];
    z11 = wsptr[1] + wsptr[7];
    z12 = wsptr[1] - wsptr[7];

    tmp7 = z11 + z13;
    tmp11 = (z11 - z13) * ((FAST_FLOAT) 1.414213562);

    z5 = (z10 + z12) * ((FAST_FLOAT) 1.847759065); /* 2*c2 */
    tmp10 = z5 - z12 * ((FAST_FLOAT) 1.082392200); /* 2*(c2-c6) */
    tmp12 = z5 - z10 * ((FAST_FLOAT) 2.613125930); /* 2*(c2+c6) */

    tmp6 = tmp12 - tmp7;
    tmp5 = tmp11 - tmp6;
    tmp4 = tmp10 - tmp5;

    /* Final output stage: float->int conversion and range-limit */

    outptr[0] = range_limit[((int) (tmp0 + tmp7)) & RANGE_MASK];
    outptr[7] = range_limit[((int) (tmp0 - tmp7)) & RANGE_MASK];
    outptr[1] = range_limit[((int) (tmp1 + tmp6)) & RANGE_MASK];
    outptr[6] = range_limit[((int) (tmp1 - tmp6)) & RANGE_MASK];
    outptr[2] = range_limit[((int) (tmp2 + tmp5)) & RANGE_MASK];
    outptr[5] = range_limit[((int) (tmp2 - tmp5)) & RANGE_MASK];
    outptr[3] = range_limit[((int) (tmp3 + tmp4)) & RANGE_MASK];
    outptr[4] = range_limit[((int) (tmp3 - tmp4)) & RANGE_MASK];
    
    wsptr += DCTSIZE;		/* advance pointer to next row */
  }
}